

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O3

bool __thiscall
AllocationPolicyManager::RequestAlloc
          (AllocationPolicyManager *this,size_t byteCount,bool externalAlloc)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  
  if (this[0x10] != (AllocationPolicyManager)0x1) {
    uVar3 = *(ulong *)(this + 8) + byteCount;
    if ((((CARRY8(*(ulong *)(this + 8),byteCount)) || (*(ulong *)this < uVar3)) ||
        ((*(code **)(this + 0x60) != (code *)0x0 &&
         (cVar1 = (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),0,byteCount),
         cVar1 == '\0')))) && (!externalAlloc)) {
      if (*(code **)(this + 0x60) != (code *)0x0) {
        (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
      }
      return false;
    }
    *(ulong *)(this + 8) = uVar3;
    return true;
  }
  CCLock::Enter((CCLock *)(this + 0x18));
  uVar3 = *(ulong *)(this + 8) + byteCount;
  if ((CARRY8(*(ulong *)(this + 8),byteCount)) || (*(ulong *)this < uVar3)) {
    if (!externalAlloc) goto LAB_00256796;
  }
  else if ((*(code **)(this + 0x60) != (code *)0x0) &&
          (cVar1 = (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),0,byteCount),
          cVar1 == '\0' && !externalAlloc)) {
LAB_00256796:
    if (*(code **)(this + 0x60) != (code *)0x0) {
      (**(code **)(this + 0x60))(*(undefined8 *)(this + 0x58),2,byteCount);
    }
    bVar2 = false;
    goto LAB_002567ef;
  }
  *(ulong *)(this + 8) = uVar3;
  bVar2 = true;
LAB_002567ef:
  CCLock::Leave((CCLock *)(this + 0x18));
  return bVar2;
}

Assistant:

bool RequestAlloc(DECLSPEC_GUARD_OVERFLOW size_t byteCount, bool externalAlloc = false)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            return RequestAllocImpl(byteCount, externalAlloc);
        }
        else
        {
            return RequestAllocImpl(byteCount, externalAlloc);
        }
    }